

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

void SetAccessorRange<unsigned_int>
               (Ref<glTF::Accessor> acc,void *data,uint count,uint numCompsIn,uint numCompsOut)

{
  void *pvVar1;
  double *pdVar2;
  long lVar3;
  undefined4 in_register_0000000c;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar7;
  double dVar8;
  double local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,count);
  pvVar7 = acc.vector;
  if (numCompsOut <= numCompsIn) {
    uVar5 = acc._8_8_ & 0xffffffff;
    if (numCompsOut != 0) {
      uVar4 = numCompsOut;
      do {
        local_40 = 1.79769313486232e+308;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&(pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar5]->min,&local_40);
        local_40 = -1.79769313486232e+308;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&(pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar5]->max,&local_40);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    uVar4 = (int)local_38 * numCompsIn;
    if (uVar4 != 0) {
      pvVar1 = (void *)((long)data + (ulong)uVar4 * 4);
      do {
        if (numCompsOut != 0) {
          uVar6 = 0;
          do {
            dVar8 = (double)*(uint *)((long)data + uVar6 * 4);
            lVar3 = *(long *)&((pvVar7->
                               super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar5]->min).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            if (dVar8 < *(double *)(lVar3 + uVar6 * 8)) {
              *(double *)(lVar3 + uVar6 * 8) = dVar8;
            }
            lVar3 = *(long *)&((pvVar7->
                               super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar5]->max).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            pdVar2 = (double *)(lVar3 + uVar6 * 8);
            if (*pdVar2 <= dVar8 && dVar8 != *pdVar2) {
              *(double *)(lVar3 + uVar6 * 8) = dVar8;
            }
            uVar6 = uVar6 + 1;
          } while (numCompsOut != uVar6);
        }
        data = (void *)((long)data + (ulong)numCompsIn * 4);
      } while (data < pvVar1);
    }
    return;
  }
  __assert_fail("numCompsOut <= numCompsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFExporter.cpp"
                ,0xb6,
                "void SetAccessorRange(Ref<Accessor>, void *, unsigned int, unsigned int, unsigned int) [T = unsigned int]"
               );
}

Assistant:

void SetAccessorRange(Ref<Accessor> acc, void* data, unsigned int count,
	unsigned int numCompsIn, unsigned int numCompsOut)
{
	ai_assert(numCompsOut <= numCompsIn);

	// Allocate and initialize with large values.
	for (unsigned int i = 0 ; i < numCompsOut ; i++) {
		acc->min.push_back( std::numeric_limits<double>::max());
		acc->max.push_back(-std::numeric_limits<double>::max());
	}

	size_t totalComps = count * numCompsIn;
	T* buffer_ptr = static_cast<T*>(data);
	T* buffer_end = buffer_ptr + totalComps;

	// Search and set extreme values.
	for (; buffer_ptr < buffer_end ; buffer_ptr += numCompsIn) {
		for (unsigned int j = 0 ; j < numCompsOut ; j++) {
			double valueTmp = buffer_ptr[j];

			if (valueTmp < acc->min[j]) {
				acc->min[j] = valueTmp;
			}
			if (valueTmp > acc->max[j]) {
				acc->max[j] = valueTmp;
			}
		}
	}
}